

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

void __thiscall Moc::parsePropertyAttributes(Moc *this,PropertyDef *propDef)

{
  char cVar1;
  Symbol *pSVar2;
  undefined1 *puVar3;
  Symbol *pSVar4;
  Data *pDVar5;
  Data *pDVar6;
  qsizetype qVar7;
  bool bVar8;
  byte bVar9;
  QTypeRevision QVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  undefined1 *puVar16;
  QByteArray *pQVar17;
  char *pcVar18;
  QArrayData *pQVar19;
  long in_FS_OFFSET;
  bool ok;
  undefined1 local_c8 [24];
  char *pcStack_b0;
  undefined1 *local_a8;
  QByteArray local_98;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[63]> local_78;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = (this->super_Parser).index;
  if (lVar12 < (this->super_Parser).symbols.d.size) {
    do {
      pSVar2 = (this->super_Parser).symbols.d.ptr;
      if (pSVar2[lVar12].token != IDENTIFIER) break;
      (this->super_Parser).index = lVar12 + 1;
      local_78.b = (char (*) [63])&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a = (char (*) [22])&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.b = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::mid((longlong)&local_78,(longlong)&pSVar2[lVar12].lex);
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'C') {
        local_58.d.d = (Data *)0x1419f1;
        bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (!bVar8) goto LAB_0011fdcd;
        propDef->constant = true;
        goto LAB_00120886;
      }
LAB_0011fdcd:
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'F') {
        local_58.d.d = (Data *)0x140c90;
        bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (bVar8) {
          propDef->final = true;
          goto LAB_00120886;
        }
      }
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'N') {
        local_58.d.d = (Data *)0x1419fa;
        bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (!bVar8) goto LAB_0011fede;
        lVar12 = (this->super_Parser).index;
        if (((this->super_Parser).symbols.d.size <= lVar12) ||
           (pSVar2 = (this->super_Parser).symbols.d.ptr, pSVar2[lVar12].token != IDENTIFIER))
        goto LAB_00120d04;
        (this->super_Parser).index = lVar12 + 1;
        QByteArray::mid((longlong)&local_58,(longlong)&pSVar2[lVar12].lex);
        pQVar19 = &((propDef->name).d.d)->super_QArrayData;
        pcVar18 = (propDef->name).d.ptr;
        (propDef->name).d.d = local_58.d.d;
        (propDef->name).d.ptr = local_58.d.ptr;
        puVar3 = (undefined1 *)(propDef->name).d.size;
        (propDef->name).d.size = local_58.d.size;
        local_58.d.d = (Data *)pQVar19;
        local_58.d.ptr = pcVar18;
        local_58.d.size = (qsizetype)puVar3;
        if (pQVar19 == (QArrayData *)0x0) goto LAB_00120886;
        LOCK();
        (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_00120886;
        goto LAB_00120877;
      }
LAB_0011fede:
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'R') {
        local_58.d.d = (Data *)0x1419ff;
        bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (!bVar8) goto LAB_0011ff16;
        propDef->required = true;
        goto LAB_00120886;
      }
LAB_0011ff16:
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'R') {
        local_58.d.d = (Data *)0x141a08;
        bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (!bVar8) goto LAB_0011ff70;
        lVar15 = (this->super_Parser).symbols.d.size;
        lVar13 = (this->super_Parser).index;
        if ((lVar13 < lVar15) && ((this->super_Parser).symbols.d.ptr[lVar13].token == LPAREN)) {
          QVar10 = parseRevision(this);
          propDef->revision = (uint)(ushort)QVar10;
          goto LAB_00120886;
        }
      }
      else {
LAB_0011ff70:
        lVar15 = (this->super_Parser).symbols.d.size;
        lVar13 = (this->super_Parser).index;
      }
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char *)0x0;
      local_98.d.size = 0;
      local_a8 = (undefined1 *)0x0;
      local_c8._16_8_ = (QArrayData *)0x0;
      pcStack_b0 = (char *)0x0;
      if (lVar15 <= lVar13) {
LAB_00120d04:
        Parser::error(&this->super_Parser,(char *)0x0);
      }
      if ((this->super_Parser).symbols.d.ptr[lVar13].token == LPAREN) {
        (this->super_Parser).index = lVar13 + 1;
        lexemUntil(&local_58,this,PP_RPAREN);
        qVar7 = local_58.d.size;
        pDVar6 = local_58.d.d;
        pcVar18 = local_98.d.ptr;
        pDVar5 = local_98.d.d;
        local_58.d.d = local_98.d.d;
        local_98.d.d = pDVar6;
        local_98.d.ptr = local_58.d.ptr;
        local_58.d.ptr = pcVar18;
        local_58.d.size = local_98.d.size;
        local_98.d.size = qVar7;
        if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar5->super_QArrayData,1,0x10);
          }
        }
        QByteArray::mid((longlong)&local_58,(longlong)&local_98);
        qVar7 = local_58.d.size;
        pcVar18 = local_98.d.ptr;
        pDVar5 = local_98.d.d;
        local_98.d.d = local_58.d.d;
        local_98.d.ptr = local_58.d.ptr;
        local_58.d.ptr = pcVar18;
        local_58.d.size = local_98.d.size;
        local_98.d.size = qVar7;
        local_58.d.d = pDVar5;
LAB_0012006f:
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      else {
        pSVar4 = (this->super_Parser).symbols.d.ptr;
        if (pSVar4[lVar13].token == INTEGER_LITERAL) {
          (this->super_Parser).index = lVar13 + 1;
          QByteArray::mid((longlong)&local_58,(longlong)&pSVar4[lVar13].lex);
          qVar7 = local_58.d.size;
          pDVar6 = local_58.d.d;
          pcVar18 = local_98.d.ptr;
          pDVar5 = local_98.d.d;
          local_58.d.d = local_98.d.d;
          local_98.d.d = pDVar6;
          local_98.d.ptr = local_58.d.ptr;
          local_58.d.ptr = pcVar18;
          local_58.d.size = local_98.d.size;
          local_98.d.size = qVar7;
          if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar5->super_QArrayData,1,0x10);
            }
          }
          local_58.d.d = (Data *)0x141a08;
          pQVar17 = &local_58;
LAB_0012013d:
          bVar8 = operator!=((QByteArray *)&local_78,(char **)pQVar17);
          if (bVar8) goto switchD_0012016f_caseD_4f;
        }
        else {
          pSVar4 = (this->super_Parser).symbols.d.ptr;
          if (pSVar4[lVar13].token == DEFAULT) {
            (this->super_Parser).index = lVar13 + 1;
            QByteArray::mid((longlong)&local_58,(longlong)&pSVar4[lVar13].lex);
            qVar7 = local_58.d.size;
            pDVar6 = local_58.d.d;
            pcVar18 = local_98.d.ptr;
            pDVar5 = local_98.d.d;
            local_58.d.d = local_98.d.d;
            local_98.d.d = pDVar6;
            local_98.d.ptr = local_58.d.ptr;
            local_58.d.ptr = pcVar18;
            local_58.d.size = local_98.d.size;
            local_98.d.size = qVar7;
            if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar5->super_QArrayData,1,0x10);
              }
            }
            local_58.d.d = (Data *)0x141a11;
            bVar8 = operator!=((QByteArray *)&local_78,(char **)&local_58);
            if (bVar8) {
              local_c8._0_8_ = "WRITE";
              pQVar17 = (QByteArray *)local_c8;
              goto LAB_0012013d;
            }
          }
          else {
            pSVar4 = (this->super_Parser).symbols.d.ptr;
            if (pSVar4[lVar13].token != IDENTIFIER) goto LAB_00120d04;
            (this->super_Parser).index = lVar13 + 1;
            QByteArray::mid((longlong)&local_58,(longlong)&pSVar4[lVar13].lex);
            qVar7 = local_58.d.size;
            pDVar6 = local_58.d.d;
            pcVar18 = local_98.d.ptr;
            pDVar5 = local_98.d.d;
            local_58.d.d = local_98.d.d;
            local_98.d.d = pDVar6;
            local_98.d.ptr = local_58.d.ptr;
            local_58.d.ptr = pcVar18;
            local_58.d.size = local_98.d.size;
            local_98.d.size = qVar7;
            if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar5->super_QArrayData,1,0x10);
              }
            }
            lVar15 = (this->super_Parser).index;
            if ((lVar15 < (this->super_Parser).symbols.d.size) &&
               ((this->super_Parser).symbols.d.ptr[lVar15].token == LPAREN)) {
              (this->super_Parser).index = lVar15 + 1;
              lexemUntil(&local_58,this,PP_RPAREN);
              pcVar18 = pcStack_b0;
              puVar3 = local_a8;
              pQVar19 = &(local_58.d.d)->super_QArrayData;
              pcStack_b0 = local_58.d.ptr;
              local_a8 = (undefined1 *)local_58.d.size;
              local_58.d.d = (Data *)local_c8._16_8_;
              local_c8._16_8_ = pQVar19;
              local_58.d.ptr = pcVar18;
              local_58.d.size = (qsizetype)puVar3;
              goto LAB_0012006f;
            }
            local_58.d.d = (Data *)0x1419bb;
            bVar8 = operator!=(&local_98,(char **)&local_58);
            if (bVar8) {
              local_c8._0_8_ = "false";
              bVar8 = operator!=(&local_98,(char **)local_c8);
              if (bVar8) {
                QByteArray::operator=((QByteArray *)(local_c8 + 0x10),"()");
              }
            }
          }
        }
      }
      cVar1 = *(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d;
      switch(cVar1) {
      case 'M':
        local_58.d.d = (Data *)0x141a1c;
        bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
        pQVar17 = &propDef->member;
        if (!bVar8) goto switchD_0012016f_caseD_4f;
        break;
      case 'N':
        local_58.d.d = (Data *)0x141a4f;
        bVar8 = operator!=((QByteArray *)&local_78,(char **)&local_58);
        pQVar17 = &propDef->notify;
        if (bVar8) goto switchD_0012016f_caseD_4f;
        break;
      case 'O':
      case 'P':
      case 'Q':
      case 'T':
      case 'V':
switchD_0012016f_caseD_4f:
        Parser::error(&this->super_Parser,pSVar2 + lVar12);
      case 'R':
        local_58.d.d = (Data *)0x141a11;
        bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
        pQVar17 = &propDef->read;
        if (!bVar8) {
          local_58.d.d = (Data *)0x141a23;
          bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
          pQVar17 = &propDef->reset;
          if (!bVar8) {
            local_58.d.d = (Data *)0x141a08;
            bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
            if (!bVar8) goto switchD_0012016f_caseD_4f;
            local_58.d.d = (Data *)((ulong)local_58.d.d & 0xffffffffffffff00);
            uVar11 = QByteArray::toInt((bool *)&local_98,(int)&local_58);
            if ((0xfe < uVar11) || ((char)local_58.d.d == '\0')) goto switchD_0012016f_caseD_4f;
            propDef->revision = uVar11 | 0xff00;
            goto LAB_00120840;
          }
        }
        break;
      case 'S':
        local_58.d.d = (Data *)0x141a29;
        bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (bVar8) {
          local_c8._0_8_ = &local_98;
          local_c8._8_8_ = local_c8 + 0x10;
          QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
                    (&local_58,(QStringBuilder<QByteArray_&,_QByteArray_&> *)local_c8);
          pQVar19 = &((propDef->scriptable).d.d)->super_QArrayData;
          (propDef->scriptable).d.d = local_58.d.d;
          pcVar18 = (propDef->scriptable).d.ptr;
          (propDef->scriptable).d.ptr = local_58.d.ptr;
          puVar3 = (undefined1 *)(propDef->scriptable).d.size;
          (propDef->scriptable).d.size = local_58.d.size;
          pcVar14 = local_58.d.ptr;
          puVar16 = (undefined1 *)local_58.d.size;
          local_58.d.d = (Data *)pQVar19;
          local_58.d.ptr = pcVar18;
          local_58.d.size = (qsizetype)puVar3;
          if (pQVar19 != (QArrayData *)0x0) {
            LOCK();
            (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar19,1,0x10);
            }
            pcVar14 = (propDef->scriptable).d.ptr;
            puVar16 = (undefined1 *)(propDef->scriptable).d.size;
          }
          if ((puVar16 != (undefined1 *)0x0) && (pcVar14[(long)(puVar16 + -1)] == ')')) {
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray(&local_58,"Providing a function for ",-1);
            pcVar18 = "SCRIPTABLE";
LAB_00120e23:
            QByteArray::operator+=(&local_58,pcVar18);
            QByteArray::operator+=
                      (&local_58," in a property declaration is not be supported in Qt 6.");
            pcVar18 = local_58.d.ptr;
            if (local_58.d.ptr == (char *)0x0) {
              pcVar18 = (char *)&QByteArray::_empty;
            }
            Parser::error(&this->super_Parser,pcVar18);
          }
        }
        else {
          local_58.d.d = (Data *)0x141a34;
          bVar8 = operator==((QByteArray *)&local_78,(char **)&local_58);
          if (!bVar8) goto switchD_0012016f_caseD_4f;
          local_c8._0_8_ = &local_98;
          local_c8._8_8_ = local_c8 + 0x10;
          QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
                    (&local_58,(QStringBuilder<QByteArray_&,_QByteArray_&> *)local_c8);
          pQVar19 = &((propDef->stored).d.d)->super_QArrayData;
          (propDef->stored).d.d = local_58.d.d;
          pcVar18 = (propDef->stored).d.ptr;
          (propDef->stored).d.ptr = local_58.d.ptr;
          puVar3 = (undefined1 *)(propDef->stored).d.size;
          (propDef->stored).d.size = local_58.d.size;
          pcVar14 = local_58.d.ptr;
          puVar16 = (undefined1 *)local_58.d.size;
          local_58.d.d = (Data *)pQVar19;
          local_58.d.ptr = pcVar18;
          local_58.d.size = (qsizetype)puVar3;
          if (pQVar19 != (QArrayData *)0x0) {
            LOCK();
            (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar19,1,0x10);
            }
            pcVar14 = (propDef->stored).d.ptr;
            puVar16 = (undefined1 *)(propDef->stored).d.size;
          }
          if ((puVar16 != (undefined1 *)0x0) && (pcVar14[(long)(puVar16 + -1)] == ')')) {
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray(&local_58,"Providing a function for ",-1);
            pcVar18 = "STORED";
            goto LAB_00120e23;
          }
        }
        goto LAB_00120840;
      case 'U':
        local_58.d.d = (Data *)0x141a56;
        bVar8 = operator!=((QByteArray *)&local_78,(char **)&local_58);
        if (bVar8) goto switchD_0012016f_caseD_4f;
        local_c8._0_8_ = &local_98;
        local_c8._8_8_ = local_c8 + 0x10;
        QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
                  (&local_58,(QStringBuilder<QByteArray_&,_QByteArray_&> *)local_c8);
        pQVar19 = &((propDef->user).d.d)->super_QArrayData;
        (propDef->user).d.d = local_58.d.d;
        pcVar18 = (propDef->user).d.ptr;
        (propDef->user).d.ptr = local_58.d.ptr;
        puVar3 = (undefined1 *)(propDef->user).d.size;
        (propDef->user).d.size = local_58.d.size;
        pcVar14 = local_58.d.ptr;
        puVar16 = (undefined1 *)local_58.d.size;
        local_58.d.d = (Data *)pQVar19;
        local_58.d.ptr = pcVar18;
        local_58.d.size = (qsizetype)puVar3;
        if (pQVar19 != (QArrayData *)0x0) {
          LOCK();
          (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar19,1,0x10);
          }
          pcVar14 = (propDef->user).d.ptr;
          puVar16 = (undefined1 *)(propDef->user).d.size;
        }
        if ((puVar16 != (undefined1 *)0x0) && (pcVar14[(long)(puVar16 + -1)] == ')')) {
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray(&local_58,"Providing a function for ",-1);
          pcVar18 = "USER";
          goto LAB_00120e23;
        }
        goto LAB_00120840;
      case 'W':
        local_58.d.d = (Data *)0x141a16;
        bVar8 = operator!=((QByteArray *)&local_78,(char **)&local_58);
        pQVar17 = &propDef->write;
        if (bVar8) goto switchD_0012016f_caseD_4f;
        break;
      default:
        if (cVar1 == 'B') {
          local_58.d.d = (Data *)0x141a3b;
          bVar8 = operator!=((QByteArray *)&local_78,(char **)&local_58);
          pQVar17 = &propDef->bind;
          if (bVar8) goto switchD_0012016f_caseD_4f;
          break;
        }
        if (cVar1 != 'D') goto switchD_0012016f_caseD_4f;
        local_58.d.d = (Data *)0x141a44;
        bVar8 = operator!=((QByteArray *)&local_78,(char **)&local_58);
        if (bVar8) goto switchD_0012016f_caseD_4f;
        local_c8._0_8_ = &local_98;
        local_c8._8_8_ = local_c8 + 0x10;
        QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
                  (&local_58,(QStringBuilder<QByteArray_&,_QByteArray_&> *)local_c8);
        pQVar19 = &((propDef->designable).d.d)->super_QArrayData;
        (propDef->designable).d.d = local_58.d.d;
        pcVar18 = (propDef->designable).d.ptr;
        (propDef->designable).d.ptr = local_58.d.ptr;
        puVar3 = (undefined1 *)(propDef->designable).d.size;
        (propDef->designable).d.size = local_58.d.size;
        pcVar14 = local_58.d.ptr;
        puVar16 = (undefined1 *)local_58.d.size;
        local_58.d.d = (Data *)pQVar19;
        local_58.d.ptr = pcVar18;
        local_58.d.size = (qsizetype)puVar3;
        if (pQVar19 != (QArrayData *)0x0) {
          LOCK();
          (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar19,1,0x10);
          }
          pcVar14 = (propDef->designable).d.ptr;
          puVar16 = (undefined1 *)(propDef->designable).d.size;
        }
        if ((puVar16 != (undefined1 *)0x0) && (pcVar14[(long)(puVar16 + -1)] == ')')) {
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray(&local_58,"Providing a function for ",-1);
          pcVar18 = "DESIGNABLE";
          goto LAB_00120e23;
        }
        goto LAB_00120840;
      }
      QByteArray::operator=(pQVar17,&local_98);
LAB_00120840:
      if ((QArrayData *)local_c8._16_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_c8._16_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_c8._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_c8._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._16_8_,1,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        pQVar19 = &(local_98.d.d)->super_QArrayData;
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_00120877:
          QArrayData::deallocate(pQVar19,1,0x10);
        }
      }
LAB_00120886:
      if ((QArrayData *)local_78.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)*local_78.a.a)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)*local_78.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)*local_78.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78.a.a,1,0x10);
        }
      }
      lVar12 = (this->super_Parser).index;
    } while (lVar12 < (this->super_Parser).symbols.d.size);
  }
  bVar9 = propDef->constant;
  if (((bool)bVar9 == true) && ((propDef->write).d.ptr != (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x141a5b;
    local_78.b = (char (*) [63])0x141a71;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[59]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[59]>
                *)&local_78);
    propDef->constant = false;
    pcVar18 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar18 = (char *)&QByteArray::_empty;
    }
    Parser::warning(&this->super_Parser,pcVar18);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    bVar9 = propDef->constant;
  }
  if (((bVar9 & 1) != 0) && ((propDef->notify).d.ptr != (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x141a5b;
    local_78.b = (char (*) [63])0x141aac;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[60]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[60]>
                *)&local_78);
    propDef->constant = false;
    pcVar18 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar18 = (char *)&QByteArray::_empty;
    }
    Parser::warning(&this->super_Parser,pcVar18);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    bVar9 = propDef->constant;
  }
  if (((bVar9 & 1) != 0) && ((propDef->bind).d.ptr != (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x141a5b;
    local_78.b = (char (*) [63])0x141ae8;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[58]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[58]>
                *)&local_78);
    propDef->constant = false;
    pcVar18 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar18 = (char *)&QByteArray::_empty;
    }
    Parser::warning(&this->super_Parser,pcVar18);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_58.d.d = (Data *)0x13f9ea;
  bVar8 = operator==(&propDef->read,(char **)&local_58);
  if ((bVar8) && ((propDef->bind).d.ptr == (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x141a5b;
    local_78.b = (char (*) [63])0x141b22;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[61]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[61]>
                *)&local_78);
    QByteArray::operator=(&propDef->read,"");
    pcVar18 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar18 = (char *)&QByteArray::_empty;
    }
    Parser::warning(&this->super_Parser,pcVar18);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_58.d.d = (Data *)0x13f9ea;
  bVar8 = operator==(&propDef->write,(char **)&local_58);
  if ((bVar8) && ((propDef->bind).d.ptr == (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x141a5b;
    local_78.b = (char (*) [63])0x141b5f;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[63]>::
    convertTo<QByteArray>(&local_58,&local_78);
    QByteArray::operator=(&propDef->write,"");
    pcVar18 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar18 = (char *)&QByteArray::_empty;
    }
    Parser::warning(&this->super_Parser,pcVar18);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::parsePropertyAttributes(PropertyDef &propDef)
{
    auto checkIsFunction = [&](const QByteArray &def, const char *name) {
        if (def.endsWith(')')) {
            QByteArray msg = "Providing a function for ";
            msg += name;
            msg += " in a property declaration is not be supported in Qt 6.";
            error(msg.constData());
        }
    };

    while (test(IDENTIFIER)) {
        const Symbol &lsym = symbol();
        const QByteArray l = lsym.lexem();
        if (l[0] == 'C' && l == "CONSTANT") {
            propDef.constant = true;
            continue;
        } else if (l[0] == 'F' && l == "FINAL") {
            propDef.final = true;
            continue;
        } else if (l[0] == 'N' && l == "NAME") {
            next(IDENTIFIER);
            propDef.name = lexem();
            continue;
        } else if (l[0] == 'R' && l == "REQUIRED") {
            propDef.required = true;
            continue;
        } else if (l[0] == 'R' && l == "REVISION" && test(LPAREN)) {
            prev();
            propDef.revision = parseRevision().toEncodedVersion<int>();
            continue;
        }

        QByteArray v, v2;
        if (test(LPAREN)) {
            v = lexemUntil(RPAREN);
            v = v.mid(1, v.size() - 2); // removes the '(' and ')'
        } else if (test(INTEGER_LITERAL)) {
            v = lexem();
            if (l != "REVISION")
                error(lsym);
        } else if (test(DEFAULT)) {
            v = lexem();
            if (l != "READ" && l != "WRITE")
                error(lsym);
        } else {
            next(IDENTIFIER);
            v = lexem();
            if (test(LPAREN))
                v2 = lexemUntil(RPAREN);
            else if (v != "true" && v != "false")
                v2 = "()";
        }
        switch (l[0]) {
        case 'M':
            if (l == "MEMBER")
                propDef.member = v;
            else
                error(lsym);
            break;
        case 'R':
            if (l == "READ")
                propDef.read = v;
            else if (l == "RESET")
                propDef.reset = v;
            else if (l == "REVISION") {
                bool ok = false;
                const int minor = v.toInt(&ok);
                if (!ok || !QTypeRevision::isValidSegment(minor))
                    error(lsym);
                propDef.revision = QTypeRevision::fromMinorVersion(minor).toEncodedVersion<int>();
            } else
                error(lsym);
            break;
        case 'S':
            if (l == "SCRIPTABLE") {
                propDef.scriptable = v + v2;
                checkIsFunction(propDef.scriptable, "SCRIPTABLE");
            } else if (l == "STORED") {
                propDef.stored = v + v2;
                checkIsFunction(propDef.stored, "STORED");
            } else
                error(lsym);
            break;
        case 'W': if (l != "WRITE") error(lsym);
            propDef.write = v;
            break;
        case 'B': if (l != "BINDABLE") error(lsym);
            propDef.bind = v;
            break;
        case 'D': if (l != "DESIGNABLE") error(lsym);
            propDef.designable = v + v2;
            checkIsFunction(propDef.designable, "DESIGNABLE");
            break;
        case 'N': if (l != "NOTIFY") error(lsym);
            propDef.notify = v;
            break;
        case 'U': if (l != "USER") error(lsym);
            propDef.user = v + v2;
            checkIsFunction(propDef.user, "USER");
            break;
        default:
            error(lsym);
        }
    }
    if (propDef.constant && !propDef.write.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both WRITEable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.constant && !propDef.notify.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both NOTIFYable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.constant && !propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both BINDable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.read == "default" && propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is not BINDable but default-READable. READ will be ignored.";
        propDef.read = "";
        warning(msg.constData());
    }
    if (propDef.write == "default" && propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is not BINDable but default-WRITEable. WRITE will be ignored.";
        propDef.write = "";
        warning(msg.constData());
    }
}